

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_add_optionv(cargo_t ctx,cargo_option_flags_t flags,char *optnames,char *description,
                     char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  void *pvVar5;
  undefined4 local_2a4;
  undefined8 *local_2a0;
  int *local_288;
  long local_270;
  undefined4 *local_268;
  undefined8 *local_250;
  undefined8 *local_238;
  undefined8 *local_220;
  undefined8 *local_208;
  undefined8 *local_1f0;
  undefined8 *local_1d8;
  undefined8 *local_1c0;
  undefined8 *local_1a8;
  undefined4 *local_190;
  uint *local_178;
  undefined4 *local_160;
  undefined8 *local_138;
  int *local_120;
  undefined8 *local_108;
  undefined8 *local_e8;
  undefined8 *local_d0;
  char *pcStack_a8;
  int nargs_is_set;
  char *mutex_grpname;
  char *grpname;
  cargo_opt_t *o;
  cargo_fmt_scanner_t s;
  size_t i;
  char **ppcStack_50;
  int ret;
  char **optname_list;
  size_t optcount;
  __va_list_tag *ap_local;
  char *fmt_local;
  char *description_local;
  char *optnames_local;
  cargo_t pcStack_18;
  cargo_option_flags_t flags_local;
  cargo_t ctx_local;
  
  optname_list = (char **)0x0;
  ppcStack_50 = (char **)0x0;
  i._4_4_ = -1;
  s.column = 0;
  s._44_4_ = 0;
  grpname = (char *)0x0;
  mutex_grpname = (char *)0x0;
  pcStack_a8 = (char *)0x0;
  bVar2 = false;
  optcount = (size_t)ap;
  ap_local = (__va_list_tag *)fmt;
  fmt_local = description;
  description_local = optnames;
  optnames_local._4_4_ = flags;
  pcStack_18 = ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1728,
                  "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                 );
  }
  if ((((flags & CARGO_OPT_DEFAULT_LITERAL) != 0) || ((ctx->flags & CARGO_DEFAULT_LITERALS) != 0))
     && ((ctx->flags & CARGO_AUTOCLEAN) == 0)) {
    return -1;
  }
  description_local =
       _cargo_get_option_group_names(ctx,optnames,&mutex_grpname,&stack0xffffffffffffff58);
  if (description_local == (char *)0x0) {
    return -1;
  }
  ppcStack_50 = _cargo_split_and_verify_option_names
                          (pcStack_18,description_local,(size_t *)&optname_list);
  if ((ppcStack_50 == (char **)0x0) ||
     (grpname = (char *)_cargo_option_init(pcStack_18,*ppcStack_50,fmt_local),
     (cargo_opt_t *)grpname == (cargo_opt_t *)0x0)) goto LAB_0010b1cc;
  if (mutex_grpname == (char *)0x0) {
    ((cargo_opt_t *)grpname)->group_index = -1;
  }
  else {
    iVar4 = cargo_group_add_option(pcStack_18,mutex_grpname,((cargo_opt_t *)grpname)->name[0]);
    if (iVar4 != 0) goto LAB_0010b1cc;
  }
  if ((pcStack_a8 != (char *)0x0) &&
     (iVar4 = cargo_mutex_group_add_option(pcStack_18,pcStack_a8,*(char **)grpname), iVar4 != 0))
  goto LAB_0010b1cc;
  _cargo_fmt_scanner_init((cargo_fmt_scanner_t *)&o,(char *)ap_local);
  _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
  cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
  if (cVar3 == '.') {
    grpname[0x44] = '\0';
    grpname[0x45] = '\0';
    grpname[0x46] = '\0';
    grpname[0x47] = '\0';
    _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
  }
  else {
    grpname[0x44] = '\x01';
    grpname[0x45] = '\0';
    grpname[0x46] = '\0';
    grpname[0x47] = '\0';
  }
  cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
  if (cVar3 == '[') {
    grpname[0xd0] = '\x01';
    grpname[0xd1] = '\0';
    grpname[0xd2] = '\0';
    grpname[0xd3] = '\0';
    _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
  }
  cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
  switch(cVar3) {
  case 'D':
    grpname[0xd0] = '\0';
    grpname[0xd1] = '\0';
    grpname[0xd2] = '\0';
    grpname[0xd3] = '\0';
    grpname[0x44] = '\x01';
    grpname[0x45] = '\0';
    grpname[0x46] = '\0';
    grpname[0x47] = '\0';
    grpname[0x3c] = ' ';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    grpname[0x80] = '\0';
    grpname[0x81] = '\0';
    grpname[0x82] = '\0';
    grpname[0x83] = '\0';
    grpname[0x84] = '\0';
    grpname[0x85] = '\0';
    grpname[0x86] = '\0';
    grpname[0x87] = '\0';
    grpname[0x88] = '\0';
    grpname[0x89] = '\0';
    grpname[0x8a] = '\0';
    grpname[0x8b] = '\0';
    grpname[0x8c] = '\0';
    grpname[0x8d] = '\0';
    grpname[0x8e] = '\0';
    grpname[0x8f] = '\0';
    grpname[0xc0] = '\0';
    grpname[0xc1] = '\0';
    grpname[0xc2] = '\0';
    grpname[0xc3] = '\0';
    grpname[0xc4] = '\0';
    grpname[0xc5] = '\0';
    grpname[0xc6] = '\0';
    grpname[199] = '\0';
    grpname[0x40] = '\0';
    grpname[0x41] = '\0';
    grpname[0x42] = '\0';
    grpname[0x43] = '\0';
    *(char **)(grpname + 0xa8) = grpname + 0x98;
    *(char **)(grpname + 0xb8) = grpname + 0xa0;
    bVar2 = true;
    break;
  default:
    _cargo_invalid_format_char
              (pcStack_18,*(char **)grpname,(char *)ap_local,(cargo_fmt_scanner_t *)&o);
    goto LAB_0010b1cc;
  case 'L':
    grpname[0x3c] = '@';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_208 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_208 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_208 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_208;
    break;
  case 'U':
    grpname[0x3c] = -0x80;
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_220 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_220 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_220 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_220;
    break;
  case 'b':
    grpname[0x3c] = '\x01';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_138 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_138 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_138 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_138;
    _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
    cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
    if (cVar3 == '!') {
      grpname[0xe8] = '\x01';
      grpname[0xe9] = '\0';
      grpname[0xea] = '\0';
      grpname[0xeb] = '\0';
    }
    else if ((cVar3 == '&') || (cVar3 == '+')) {
LAB_0010a5e2:
      cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
      if (cVar3 == '&') {
        grpname[0xf8] = '\x02';
        grpname[0xf9] = '\0';
        grpname[0xfa] = '\0';
        grpname[0xfb] = '\0';
      }
      else if (cVar3 == '+') {
        grpname[0xf8] = '\0';
        grpname[0xf9] = '\0';
        grpname[0xfa] = '\0';
        grpname[0xfb] = '\0';
      }
      else if (cVar3 == '_') {
        grpname[0xf8] = '\x03';
        grpname[0xf9] = '\0';
        grpname[0xfa] = '\0';
        grpname[0xfb] = '\0';
      }
      else {
        grpname[0xf8] = '\x01';
        grpname[0xf9] = '\0';
        grpname[0xfa] = '\0';
        grpname[0xfb] = '\0';
      }
      grpname[0x100] = '\0';
      grpname[0x101] = '\0';
      grpname[0x102] = '\0';
      grpname[0x103] = '\0';
      grpname[0x104] = '\0';
      grpname[0x105] = '\0';
      grpname[0x106] = '\0';
      grpname[0x107] = '\0';
      uVar1 = *(uint *)optcount;
      if (uVar1 < 0x29) {
        local_178 = (uint *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
        *(uint *)optcount = uVar1 + 8;
      }
      else {
        local_178 = *(uint **)(optcount + 8);
        *(uint **)(optcount + 8) = local_178 + 2;
      }
      *(ulong *)(grpname + 0x108) = (ulong)*local_178;
      pvVar5 = _cargo_calloc(*(size_t *)(grpname + 0x108),4);
      *(void **)(grpname + 0xf0) = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_0010b1cc;
      s.column = 0;
      s._44_4_ = 0;
      for (; (ulong)s._40_8_ < *(ulong *)(grpname + 0x108); s._40_8_ = s._40_8_ + 1) {
        uVar1 = *(uint *)optcount;
        if (uVar1 < 0x29) {
          local_190 = (undefined4 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
          *(uint *)optcount = uVar1 + 8;
        }
        else {
          local_190 = *(undefined4 **)(optcount + 8);
          *(undefined4 **)(optcount + 8) = local_190 + 2;
        }
        *(undefined4 *)(*(long *)(grpname + 0xf0) + s._40_8_ * 4) = *local_190;
      }
    }
    else if (cVar3 == '=') {
      uVar1 = *(uint *)optcount;
      if (uVar1 < 0x29) {
        local_160 = (undefined4 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
        *(uint *)optcount = uVar1 + 8;
      }
      else {
        local_160 = *(undefined4 **)(optcount + 8);
        *(undefined4 **)(optcount + 8) = local_160 + 2;
      }
      *(undefined4 *)(grpname + 0xe4) = *local_160;
    }
    else {
      if ((cVar3 == '_') || (cVar3 == '|')) goto LAB_0010a5e2;
      grpname[0xe4] = '\x01';
      grpname[0xe5] = '\0';
      grpname[0xe6] = '\0';
      grpname[0xe7] = '\0';
      grpname[0xe8] = '\0';
      grpname[0xe9] = '\0';
      grpname[0xea] = '\0';
      grpname[0xeb] = '\0';
      grpname[0xf0] = '\0';
      grpname[0xf1] = '\0';
      grpname[0xf2] = '\0';
      grpname[0xf3] = '\0';
      grpname[0xf4] = '\0';
      grpname[0xf5] = '\0';
      grpname[0xf6] = '\0';
      grpname[0xf7] = '\0';
      _cargo_fmt_prev_token((cargo_fmt_scanner_t *)&o);
    }
    break;
  case 'c':
    if (*(int *)(grpname + 0x44) == 0) {
      grpname[0x44] = '\x01';
      grpname[0x45] = '\0';
      grpname[0x46] = '\0';
      grpname[0x47] = '\0';
    }
    grpname[0x3c] = ' ';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_d0 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_d0 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_d0 + 1;
    }
    *(undefined8 *)(grpname + 0x80) = *local_d0;
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_e8 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_e8 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_e8 + 1;
    }
    *(undefined8 *)(grpname + 0x88) = *local_e8;
    *(char **)(grpname + 0xa8) = grpname + 0x98;
    *(char **)(grpname + 0xb8) = grpname + 0xa0;
    grpname[0xc0] = '\0';
    grpname[0xc1] = '\0';
    grpname[0xc2] = '\0';
    grpname[0xc3] = '\0';
    grpname[0xc4] = '\0';
    grpname[0xc5] = '\0';
    grpname[0xc6] = '\0';
    grpname[199] = '\0';
    _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
    cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
    if (cVar3 == '0') {
      grpname[0x40] = '\0';
      grpname[0x41] = '\0';
      grpname[0x42] = '\0';
      grpname[0x43] = '\0';
    }
    else {
      _cargo_fmt_prev_token((cargo_fmt_scanner_t *)&o);
      grpname[0x40] = '\x01';
      grpname[0x41] = '\0';
      grpname[0x42] = '\0';
      grpname[0x43] = '\0';
    }
    bVar2 = true;
    break;
  case 'd':
    grpname[0x3c] = '\x10';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_1c0 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_1c0 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_1c0 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_1c0;
    break;
  case 'f':
    grpname[0x3c] = '\b';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_1f0 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_1f0 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_1f0 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_1f0;
    break;
  case 'i':
    grpname[0x3c] = '\x02';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_1a8 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_1a8 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_1a8 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_1a8;
    break;
  case 's':
    grpname[0x3c] = ' ';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_108 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_108 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_108 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_108;
    _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
    cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
    if (cVar3 == '#') {
      uVar1 = *(uint *)optcount;
      if (uVar1 < 0x29) {
        local_120 = (int *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
        *(uint *)optcount = uVar1 + 8;
      }
      else {
        local_120 = *(int **)(optcount + 8);
        *(int **)(optcount + 8) = local_120 + 2;
      }
      *(long *)(grpname + 0xc0) = (long)*local_120;
    }
    else {
      grpname[0xc0] = '\0';
      grpname[0xc1] = '\0';
      grpname[0xc2] = '\0';
      grpname[0xc3] = '\0';
      grpname[0xc4] = '\0';
      grpname[0xc5] = '\0';
      grpname[0xc6] = '\0';
      grpname[199] = '\0';
      _cargo_fmt_prev_token((cargo_fmt_scanner_t *)&o);
    }
    break;
  case 'u':
    grpname[0x3c] = '\x04';
    grpname[0x3d] = '\0';
    grpname[0x3e] = '\0';
    grpname[0x3f] = '\0';
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_1d8 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_1d8 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_1d8 + 1;
    }
    *(undefined8 *)(grpname + 0xa8) = *local_1d8;
  }
  if (*(int *)(grpname + 0xd0) == 0) {
    if (*(int *)(grpname + 0x3c) == 1) {
      grpname[0x40] = '\0';
      grpname[0x41] = '\0';
      grpname[0x42] = '\0';
      grpname[0x43] = '\0';
    }
    else {
      _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
      cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
      if (cVar3 == '?') {
        grpname[0x40] = -3;
        grpname[0x41] = -1;
        grpname[0x42] = -1;
        grpname[0x43] = -1;
        uVar1 = *(uint *)optcount;
        if (uVar1 < 0x29) {
          local_2a0 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
          *(uint *)optcount = uVar1 + 8;
        }
        else {
          local_2a0 = *(undefined8 **)(optcount + 8);
          *(undefined8 **)(optcount + 8) = local_2a0 + 1;
        }
        *(undefined8 *)(grpname + 0x110) = *local_2a0;
      }
      else {
        _cargo_fmt_prev_token((cargo_fmt_scanner_t *)&o);
        if (!bVar2) {
          grpname[0x40] = '\x01';
          grpname[0x41] = '\0';
          grpname[0x42] = '\0';
          grpname[0x43] = '\0';
        }
      }
    }
    if (*(int *)(grpname + 0x3c) == 0x20) {
      local_2a4 = *(undefined4 *)(grpname + 0x44);
    }
    else {
      local_2a4 = 0;
    }
    *(undefined4 *)(grpname + 0x44) = local_2a4;
    grpname[200] = '\x01';
    grpname[0xc9] = '\0';
    grpname[0xca] = '\0';
    grpname[0xcb] = '\0';
    grpname[0xcc] = '\0';
    grpname[0xcd] = '\0';
    grpname[0xce] = '\0';
    grpname[0xcf] = '\0';
    goto LAB_0010b03e;
  }
  if (*(long *)(grpname + 0x80) == 0) {
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_250 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_250 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_250 + 1;
    }
    *(undefined8 *)(grpname + 0xb8) = *local_250;
  }
  else {
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_238 = (undefined8 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_238 = *(undefined8 **)(optcount + 8);
      *(undefined8 **)(optcount + 8) = local_238 + 1;
    }
    *(undefined8 *)(grpname + 0x90) = *local_238;
  }
  _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
  cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
  if (cVar3 != ']') goto LAB_0010b1cc;
  _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
  if (*(int *)(grpname + 0x44) == 0) {
    if ((char)ap_local->gp_offset != '.') {
      __assert_fail("*fmt == \'.\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x1860,
                    "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                   );
    }
    uVar1 = *(uint *)optcount;
    if (uVar1 < 0x29) {
      local_288 = (int *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
      *(uint *)optcount = uVar1 + 8;
    }
    else {
      local_288 = *(int **)(optcount + 8);
      *(int **)(optcount + 8) = local_288 + 2;
    }
    *(long *)(grpname + 200) = (long)*local_288;
    cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
    if (cVar3 == '#') {
LAB_0010aec9:
      *(int *)(grpname + 0x40) = (int)*(undefined8 *)(grpname + 200);
    }
    else if (cVar3 == '*') {
      grpname[0x40] = -2;
      grpname[0x41] = -1;
      grpname[0x42] = -1;
      grpname[0x43] = -1;
    }
    else {
      if (cVar3 != '+') {
        if (cVar3 != 'N') {
          _cargo_invalid_format_char
                    (pcStack_18,*(char **)grpname,(char *)ap_local,(cargo_fmt_scanner_t *)&o);
          goto LAB_0010b1cc;
        }
        goto LAB_0010aec9;
      }
      grpname[0x40] = -1;
      grpname[0x41] = -1;
      grpname[0x42] = -1;
      grpname[0x43] = -1;
    }
  }
  else {
    cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
    if (cVar3 == '#') {
LAB_0010acf0:
      uVar1 = *(uint *)optcount;
      if (uVar1 < 0x29) {
        local_268 = (undefined4 *)((long)(int)uVar1 + *(long *)(optcount + 0x10));
        *(uint *)optcount = uVar1 + 8;
      }
      else {
        local_268 = *(undefined4 **)(optcount + 8);
        *(undefined4 **)(optcount + 8) = local_268 + 2;
      }
      *(undefined4 *)(grpname + 0x40) = *local_268;
    }
    else if (cVar3 == '*') {
      grpname[0x40] = -2;
      grpname[0x41] = -1;
      grpname[0x42] = -1;
      grpname[0x43] = -1;
    }
    else {
      if (cVar3 != '+') {
        if (cVar3 != 'N') {
          _cargo_invalid_format_char
                    (pcStack_18,*(char **)grpname,(char *)ap_local,(cargo_fmt_scanner_t *)&o);
          goto LAB_0010b1cc;
        }
        goto LAB_0010acf0;
      }
      grpname[0x40] = -1;
      grpname[0x41] = -1;
      grpname[0x42] = -1;
      grpname[0x43] = -1;
    }
    if (*(int *)(grpname + 0x40) < 0) {
      local_270 = -1;
    }
    else {
      local_270 = (long)*(int *)(grpname + 0x40);
    }
    *(long *)(grpname + 200) = local_270;
  }
LAB_0010b03e:
  _cargo_fmt_next_token((cargo_fmt_scanner_t *)&o);
  cVar3 = _cargo_fmt_token((cargo_fmt_scanner_t *)&o);
  if (cVar3 == '\0') {
    *(cargo_option_flags_t *)(grpname + 0xd8) = optnames_local._4_4_;
    grpname[0xe0] = '\x01';
    grpname[0xe1] = '\0';
    grpname[0xe2] = '\0';
    grpname[0xe3] = '\0';
    cVar3 = _cargo_is_prefix(pcStack_18,**(char **)grpname);
    *(uint *)(grpname + 0x38) = (uint)((cVar3 != '\0' ^ 0xffU) & 1);
    if ((((*(int *)(grpname + 0x38) != 0) && ((*(uint *)(grpname + 0xd8) & 4) == 0)) &&
        (*(int *)(grpname + 0x40) != -2)) && (*(int *)(grpname + 0x40) != -3)) {
      *(uint *)(grpname + 0xd8) = *(uint *)(grpname + 0xd8) | 2;
    }
    iVar4 = _cargo_validate_option_args(pcStack_18,(cargo_opt_t *)grpname);
    if (iVar4 == 0) {
      if (((*(int *)(grpname + 0x3c) == 0x20) && (*(int *)(grpname + 0x40) != 1)) &&
         ((*(long *)(grpname + 0xc0) == 0 && (*(int *)(grpname + 0x44) == 0)))) {
        grpname[0x48] = '\x01';
        grpname[0x49] = '\0';
        grpname[0x4a] = '\0';
        grpname[0x4b] = '\0';
      }
      s.column = 1;
      s._44_4_ = 0;
      for (; (ulong)s._40_8_ < optname_list; s._40_8_ = s._40_8_ + 1) {
        iVar4 = cargo_add_alias(pcStack_18,*ppcStack_50,ppcStack_50[s._40_8_]);
        if (iVar4 != 0) goto LAB_0010b1cc;
      }
      i._4_4_ = 0;
    }
  }
  else {
    _cargo_invalid_format_char
              (pcStack_18,*(char **)grpname,(char *)ap_local,(cargo_fmt_scanner_t *)&o);
  }
LAB_0010b1cc:
  if ((i._4_4_ < 0) && (grpname != (char *)0x0)) {
    _cargo_option_destroy((cargo_opt_t *)grpname);
    pcStack_18->opt_count = pcStack_18->opt_count - 1;
  }
  _cargo_xfree(&mutex_grpname);
  _cargo_xfree(&stack0xffffffffffffff58);
  _cargo_free_str_list(&stack0xffffffffffffffb0,(size_t *)&optname_list);
  return i._4_4_;
}

Assistant:

int cargo_add_optionv(cargo_t ctx, cargo_option_flags_t flags,
                         const char *optnames, const char *description,
                         const char *fmt, va_list ap)
{
    size_t optcount = 0;
    char **optname_list = NULL;
    int ret = -1;
    size_t i = 0;
    cargo_fmt_scanner_t s;
    cargo_opt_t *o = NULL;
    char *grpname = NULL;
    char *mutex_grpname = NULL;
    int nargs_is_set = 0;
    assert(ctx);

    CARGODBG(2, "-------- Add option \"%s\", \"%s\" --------\n", optnames, fmt);

    if ((
            (flags & CARGO_OPT_DEFAULT_LITERAL) ||
            (ctx->flags & CARGO_DEFAULT_LITERALS)
        )
        && !(ctx->flags & CARGO_AUTOCLEAN))
    {
        CARGODBG(1, "Option flag CARGO_OPT_DEFAULT_LITERAL or global flag "
                    "CARGO_DEFAULT_LITERALS must be "
                    "combined with the global flag CARGO_AUTOCLEAN "
                    "to avoid memory leak / crash.");
        return -1;
    }

    // TODO: Allow multiple mutex groups...
    if (!(optnames = _cargo_get_option_group_names(ctx, optnames,
                        &grpname, &mutex_grpname)))
    {
        CARGODBG(1, "Failed to parse group name\n");
        return -1;
    }

    CARGODBG(2, " Group: \"%s\", Optnames: \"%s\"\n", grpname, optnames);

    if (!(optname_list = _cargo_split_and_verify_option_names(ctx, optnames, &optcount)))
    {
        CARGODBG(1, "Failed to split option names \"%s\"\n", optnames);
        goto fail;
    }

    if (!(o = _cargo_option_init(ctx, optname_list[0], description)))
    {
        CARGODBG(1, "Failed to init option\n");
        goto fail;
    }

    if (grpname)
    {
        CARGODBG(2, "Add \"%s\" to group \"%s\"\n", o->name[0], grpname);

        if (cargo_group_add_option(ctx, grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to group \"%s\"\n",
                    o->name[0], grpname);
            goto fail;
        }
    }
    else
    {
        CARGODBG(2, "Add \"%s\" to default group\n", o->name[0]);
        o->group_index = -1;
    }

    if (mutex_grpname)
    {
        CARGODBG(2, "Add \"%s\" to mutex group \"%s\"\n", o->name[0], mutex_grpname);

        if (cargo_mutex_group_add_option(ctx, mutex_grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to mutex group \"%s\"",
                    o->name[0], mutex_grpname);
            goto fail;
        }
    }

    // Start parsing the format string.
    _cargo_fmt_scanner_init(&s, fmt);
    _cargo_fmt_next_token(&s);

    // Get the first token.
    if (_cargo_fmt_token(&s) == '.')
    {
        CARGODBG(2, "Static\n");
        o->alloc = 0;
        _cargo_fmt_next_token(&s);
    }
    else
    {
        o->alloc = 1;
    }

    if (_cargo_fmt_token(&s) == '[')
    {
        CARGODBG(4, "   [\n");
        o->array = 1;
        _cargo_fmt_next_token(&s);
    }

    switch (_cargo_fmt_token(&s))
    {
        //
        // !!!WARNING!!!
        // Do not attempt to refactor and put these longer cases in
        // separate functions. Passing a va_list around is dangerous.
        // This works fine on Unix, but fails randomly on Windows!
        //

        // Same as string, but the target is internal
        // and will be passed to the user specified callback.
        case 'c':
        {
            CARGODBG(4, "Custom callback\n");

            if (!o->alloc)
            {
                CARGODBG(1, "WARNING! Static '.' is ignored for a custom "
                            "callback the memory for the arguments is "
                            "allocated internally.");
                o->alloc = 1;
            }

            o->type = CARGO_STRING;
            o->custom = va_arg(ap, cargo_custom_f);
            o->custom_user = va_arg(ap, void *);

            // We use an internal target for custom variables, this will then
            // be passed on to the callback as argv and argc.
            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            o->lenstr = 0;

            if (!o->custom)
            {
                CARGODBG(2, "Warning: Got NULL custom callback pointer\n");
            }

            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // A shortcut to "[c]#", cbfunc, NULL, NULL, 0.
                // which makes a custom callback a bool flag basically.
                case '0': o->nargs = 0; break;
                default:
                {
                    _cargo_fmt_prev_token(&s);
                    o->nargs = 1;
                    break;
                }
            }

            nargs_is_set = 1;

            break;
        }
        case 'D': // D as in Dummy.
        {
            // Shortcut for: "c0", NULL, NULL;
            // That is a dummy callback. This is mostly useful
            // for using in a mutex group.
            o->array = 0;
            o->alloc = 1;
            o->type = CARGO_STRING;
            o->custom = NULL;
            o->custom_user = NULL;
            o->lenstr = 0;
            o->nargs = 0;

            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            nargs_is_set = 1;
            break;
        }
        case 's':
        {
            o->type = CARGO_STRING;
            o->target = (void *)va_arg(ap, char *);

            CARGODBG(4, "Read string\n");
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '#')
            {
                o->lenstr = (size_t)va_arg(ap, int);
                CARGODBG(4, "String length: %lu\n", o->lenstr);

                if (o->alloc)
                {
                    CARGODBG(1, "%s: WARNING! Usually restricting the size of a "
                        "string using # is only done on static strings.\n"
                        "    Are you sure you want this?\n",
                        o->name[0]);
                    CARGODBG(1, "      \"%s\"\n", s.start);
                    CARGODBG(1, "       %*s\n", s.column, "^");
                }
            }
            else
            {
                // String size not fixed.
                o->lenstr = 0;
                _cargo_fmt_prev_token(&s);
            }

            break;
        }
        case 'b':
        {
            o->type = CARGO_BOOL;
            o->target = va_arg(ap, void *);

            // Look for any modifier tokens.
            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // Read an int that will be stored in the bool value (Default 1)
                case '=': o->bool_store = va_arg(ap, int); break;
                // Count flag occurances.
                case '!': o->bool_count = 1; break;
                case '|':
                case '+':
                case '&':
                case '_':
                {
                    switch (_cargo_fmt_token(&s))
                    {
                        default:
                        case '|': o->bool_acc_op = CARGO_BOOL_OP_OR; break;
                        case '+': o->bool_acc_op = CARGO_BOOL_OP_PLUS; break;
                        case '&': o->bool_acc_op = CARGO_BOOL_OP_AND; break;
                        case '_': o->bool_acc_op = CARGO_BOOL_OP_STORE; break;
                    }

                    o->bool_acc_count = 0;
                    o->bool_acc_max_count = (size_t)va_arg(ap, unsigned int);
                    CARGODBG(3, "Bool acc max count %lu\n", o->bool_acc_max_count);

                    if (!(o->bool_acc = _cargo_calloc(o->bool_acc_max_count, sizeof(int))))
                    {
                        CARGODBG(1, "Out of memory\n");
                        goto fail;
                    }

                    for (i = 0; i < o->bool_acc_max_count; i++)
                    {
                        o->bool_acc[i] = va_arg(ap, int);
                        CARGODBG(3, "  bool acc value %lu: 0x%x\n", i, o->bool_acc[i]);
                    }
                    break;
                }
                default:
                {
                    // Got no flag modifier token.
                    o->bool_store = 1;
                    o->bool_count = 0;
                    o->bool_acc = NULL;
                    _cargo_fmt_prev_token(&s);
                }
            }

            break;
        }
        // TODO: Maybe replace target here with a union?
        case 'i': o->type = CARGO_INT;    o->target = va_arg(ap, void *); break;
        case 'd': o->type = CARGO_DOUBLE; o->target = va_arg(ap, void *); break;
        case 'u': o->type = CARGO_UINT;   o->target = va_arg(ap, void *); break;
        case 'f': o->type = CARGO_FLOAT;  o->target = va_arg(ap, void *); break;
        case 'L': o->type = CARGO_LONGLONG;   o->target = va_arg(ap, void *); break;
        case 'U': o->type = CARGO_ULONGLONG;  o->target = va_arg(ap, void *); break;
        default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);goto fail;
    }

    if (o->array)
    {
        // Custom callbacks uses an internal target and count.
        // However we still return the count in a separate
        // user specified value for arrays.
        if (o->custom)
        {
            o->custom_user_count = va_arg(ap, size_t *);
        }
        else
        {
            // This is where we return the number of arguments
            // we have parsed for this option.
            o->target_count = va_arg(ap, size_t *);
        }

        _cargo_fmt_next_token(&s);

        if (_cargo_fmt_token(&s) != ']')
        {
            CARGODBG(1, "%s: Expected ']'\n", o->name[0]);
            CARGODBG(1, "      \"%s\"\n", fmt);
            CARGODBG(1, "        %*s\n", s.column, "^");
            goto fail;
        }

        _cargo_fmt_next_token(&s);

        if (o->alloc)
        {
            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = va_arg(ap, int); break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }

            // By default "nargs" is the max number of arguments the option should parse.
            o->max_target_count = (o->nargs >= 0) ? o->nargs : (size_t)(-1);
        }
        else
        {
            assert(*fmt == '.');
            // If we have a static array. For example:
            // "int val[4];"
            // The max target count must still always be specified
            // if we use "+" or "*" when in static mode.
            o->max_target_count = va_arg(ap, int);

            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = o->max_target_count; break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }
        }
    }
    else
    {
        // Non-array.

        if (o->type == CARGO_BOOL)
        {
            // BOOLs never have arguments.
            o->nargs = 0;
        }
        else
        {
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '?')
            {
                o->nargs = CARGO_NARGS_ZERO_OR_ONE;
                o->zero_or_one_default = va_arg(ap, char *);
            }
            else
            {
                _cargo_fmt_prev_token(&s);

                if (!nargs_is_set)
                {
                    o->nargs = 1;
                }
            }
        }

        // Never allocate single values (unless it's a string).
        o->alloc = (o->type != CARGO_STRING) ? 0 : o->alloc;
        o->max_target_count = 1;
    }

    _cargo_fmt_next_token(&s);

    if (_cargo_fmt_token(&s) != '\0')
    {
        _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
        CARGODBG(1, "Got garbage at end of format string\n");
        goto fail;
    }

    o->flags = flags;
    o->first_parse = 1;

    // Check if the option has a prefix
    // (if not it's positional).
    o->positional = !_cargo_is_prefix(ctx, o->name[0][0]);

    if (o->positional
        && !(o->flags & CARGO_OPT_NOT_REQUIRED)
        && (o->nargs != CARGO_NARGS_ZERO_OR_MORE)
        && (o->nargs != CARGO_NARGS_ZERO_OR_ONE))
    {
        CARGODBG(2, "Positional argument %s required by default\n", o->name[0]);
        o->flags |= CARGO_OPT_REQUIRED;
    }

    if (_cargo_validate_option_args(ctx, o))
    {
        goto fail;
    }

    // .[s]#  .[s]+  .[s]*
    if ((o->type == CARGO_STRING)
         && (o->nargs != 1)
         && (o->lenstr == 0)
         && !o->alloc)
    {
        // A list of strings with a static size is a special case:
        //   char *strs[5];
        // Since we only want to allocate memory for the individual
        // strings we parse, but not the entire list (as with):
        //   char **strs;
        // The format string for this would be ".[s]#"
        //
        // nargs != 1 && nargs != -1:
        //   So we want nargs to be set, but not to infinite (-1),
        //   this means # was used.
        // lenstr == 0:
        //   .[s#]# would mean we have something like char strs[5][15];
        // !alloc:
        //   The list is not to be allocated.

        // So in this case we are not allocating the list itself
        // since that is of a fixed size. But we want to allocate
        // each individual item string.
        o->str_alloc_items = 1;
    }

    for (i = 1; i < optcount; i++)
    {
        if (cargo_add_alias(ctx, optname_list[0], optname_list[i]))
        {
            goto fail;
        }
    }

    CARGODBG(2, " Option %s:\n", o->name[0]);
    CARGODBG(2, "   max_target_count = %lu\n", o->max_target_count);
    CARGODBG(2, "   alloc = %d\n", o->alloc);
    CARGODBG(2, "   lenstr = %lu\n", o->lenstr);
    CARGODBG(2, "   nargs = %d\n", o->nargs);
    CARGODBG(2, "   positional = %d\n", o->positional);
    CARGODBG(2, "   array = %d\n", o->array);
    CARGODBG(2, "   \n");

    ret = 0;

fail:
    if (ret < 0)
    {
        if (o)
        {
            _cargo_option_destroy(o);
            ctx->opt_count--;
        }
    }

    _cargo_xfree(&grpname);
    _cargo_xfree(&mutex_grpname);
    _cargo_free_str_list(&optname_list, &optcount);

    return ret;
}